

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

int stbi__jpeg_test(stbi__context *s)

{
  stbi_uc sVar1;
  stbi__jpeg *j;
  uint uVar2;
  long in_FS_OFFSET;
  
  j = (stbi__jpeg *)calloc(1,0x4888);
  if (j == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
    uVar2 = 0;
  }
  else {
    j->s = s;
    j->idct_block_kernel = stbi__idct_simd;
    j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    j->app14_color_transform = -1;
    j->marker = 0xff;
    sVar1 = stbi__get_marker(j);
    if (sVar1 != 0xd8) {
      *(char **)(in_FS_OFFSET + -8) = "no SOI";
    }
    uVar2 = (uint)(sVar1 == 0xd8);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    free(j);
  }
  return uVar2;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg* j = (stbi__jpeg*)stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__err("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   j->s = s;
   stbi__setup_jpeg(j);
   r = stbi__decode_jpeg_header(j, STBI__SCAN_type);
   stbi__rewind(s);
   STBI_FREE(j);
   return r;
}